

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrLDX0xb6(CPU *this)

{
  byte bVar1;
  
  bVar1 = zeropage_y_addr(this);
  this->X = bVar1;
  this->field_0x2e = bVar1 >> 7 | (bVar1 == 0) << 6 | this->field_0x2e & 0xbe;
  return 4;
}

Assistant:

int CPU::instrLDX0xb6() {
	LDX(zeropage_y_addr());
	return 4;
}